

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateDefaultSubFramebufferBindCase::render
          (InvalidateDefaultSubFramebufferBindCase *this,Surface *dst)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  DataTypes *samplerTypes;
  Context *pCVar4;
  size_type sVar5;
  reference attachments_00;
  ContextWrapper *this_00;
  Vector<float,_3> local_55c;
  Vector<float,_3> local_550;
  Vector<float,_3> local_544;
  Vector<float,_3> local_538;
  Vector<float,_3> local_52c;
  Vector<float,_3> local_520;
  Vector<float,_4> local_514;
  Vector<float,_4> local_504;
  Vector<float,_4> local_4f4;
  int local_4e4;
  int local_4e0;
  int invalidateH;
  int invalidateW;
  int invalidateY;
  int invalidateX;
  deUint32 gradShaderID;
  deUint32 texShaderID;
  deUint32 flatShaderID;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  GradientShader gradShader;
  Vector<float,_4> local_344;
  DataTypes local_328;
  undefined1 local_310 [8];
  Texture2DShader texShader;
  FlatColorShader flatShader;
  deUint32 tex;
  deUint32 fbo;
  Surface *dst_local;
  InvalidateDefaultSubFramebufferBindCase *this_local;
  
  flatShader.super_ShaderProgram._340_4_ = 0;
  flatShader.super_ShaderProgram.m_hasGeometryShader = false;
  flatShader.super_ShaderProgram._337_3_ = 0;
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)&texShader.m_outputType,TYPE_FLOAT_VEC4);
  local_328.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_328);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_328,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector(&local_344,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gradShader.super_ShaderProgram.field_0x154,0.0)
  ;
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_310,samplerTypes,TYPE_FLOAT_VEC4,&local_344,
             (Vec4 *)&gradShader.super_ShaderProgram.field_0x154);
  FboTestUtil::DataTypes::~DataTypes(&local_328);
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID,this->m_buffers);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  gradShaderID = (*pCVar4->_vptr_Context[0x75])(pCVar4,&texShader.m_outputType);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  invalidateX = (*pCVar4->_vptr_Context[0x75])(pCVar4,local_310);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  invalidateY = (*pCVar4->_vptr_Context[0x75])
                          (pCVar4,&attachments.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  invalidateW = iVar2 >> 2;
  iVar2 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  invalidateH = iVar2 >> 2;
  local_4e0 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  local_4e0 = local_4e0 / 2;
  local_4e4 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  local_4e4 = local_4e4 / 2;
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = gradShaderID;
  tcu::Vector<float,_4>::Vector(&local_4f4,1.0,0.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)&texShader.m_outputType,pCVar4,dVar1,&local_4f4);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_310,pCVar4,invalidateX);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  iVar2 = invalidateY;
  tcu::Vector<float,_4>::Vector(&local_504,0.0);
  tcu::Vector<float,_4>::Vector(&local_514,1.0);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar4,iVar2,&local_504,&local_514);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&flatShader.super_ShaderProgram.field_0x154);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,
             (deUint32 *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
             flatShader.super_ShaderProgram._336_4_);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x8058,iVar2,iVar3,0,0x1908,0x1401,(void *)0x0)
  ;
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2601);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,
             flatShader.super_ShaderProgram._340_4_);
  sglr::ContextWrapper::glFramebufferTexture2D
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0xde1,
             flatShader.super_ShaderProgram._336_4_,0);
  sglr::ContextWrapper::glBindTexture(&(this->super_FboTestCase).super_ContextWrapper,0xde1,0);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = gradShaderID;
  tcu::Vector<float,_3>::Vector(&local_520,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_52c,1.0,1.0,1.0);
  sglr::drawQuad(pCVar4,dVar1,&local_520,&local_52c);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID);
  attachments_00 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID,0);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar5,attachments_00,
             invalidateW,invalidateH,local_4e0,local_4e4);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,
             flatShader.super_ShaderProgram._340_4_);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  iVar2 = invalidateY;
  tcu::Vector<float,_3>::Vector(&local_538,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_544,1.0,1.0,0.0);
  sglr::drawQuad(pCVar4,iVar2,&local_538,&local_544);
  sglr::ContextWrapper::glBindFramebuffer(&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,1.0,0.0,1.0);
  sglr::ContextWrapper::glClearStencil(&(this->super_FboTestCase).super_ContextWrapper,1);
  sglr::ContextWrapper::glScissor
            (&(this->super_FboTestCase).super_ContextWrapper,invalidateW,invalidateH,local_4e0,
             local_4e4);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,this->m_buffers);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,
             flatShader.super_ShaderProgram._336_4_);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  iVar2 = invalidateX;
  tcu::Vector<float,_3>::Vector(&local_550,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_55c,1.0,1.0,0.0);
  sglr::drawQuad(pCVar4,iVar2,&local_550,&local_55c);
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar2,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texShaderID);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_310);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)&texShader.m_outputType);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		deUint32			fbo				= 0;
		deUint32			tex				= 0;
		FlatColorShader		flatShader		(glu::TYPE_FLOAT_VEC4);
		Texture2DShader		texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
		GradientShader		gradShader		(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments		= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID	= getCurrentContext()->createProgram(&flatShader);
		deUint32			texShaderID		= getCurrentContext()->createProgram(&texShader);
		deUint32			gradShaderID	= getCurrentContext()->createProgram(&gradShader);

		int				invalidateX		= getWidth()	/ 4;
		int				invalidateY		= getHeight()	/ 4;
		int				invalidateW		= getWidth()	/ 2;
		int				invalidateH		= getHeight()	/ 2;


		flatShader.setColor   (*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		texShader.setUniforms (*getCurrentContext(), texShaderID);
		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		// Create fbo.
		glGenFramebuffers		(1, &fbo);
		glGenTextures			(1, &tex);
		glBindTexture			(GL_TEXTURE_2D, tex);
		glTexImage2D			(GL_TEXTURE_2D, 0, GL_RGBA8, getWidth(), getHeight(), 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL);
		glTexParameteri			(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);
		glBindTexture			(GL_TEXTURE_2D, 0);
		checkFramebufferStatus	(GL_FRAMEBUFFER);

		glBindFramebuffer		(GL_FRAMEBUFFER, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Switch to fbo and render gradient into it.
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);
		glBindFramebuffer	(GL_FRAMEBUFFER, fbo);

		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Restore default fbo.
		glBindFramebuffer	(GL_FRAMEBUFFER, 0);

		// Clear invalidated buffers.
		glClearColor	(0.0f, 1.0f, 0.0f, 1.0f);
		glClearStencil	(1);
		glScissor		(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable		(GL_SCISSOR_TEST);
		glClear			(m_buffers);
		glDisable		(GL_SCISSOR_TEST);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);
		glBindTexture	(GL_TEXTURE_2D, tex);

		sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}